

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O0

void update_ref_speed(SpurUserParamsPtr spur)

{
  OdometryPtr p_Var1;
  int local_1c;
  int i;
  OdometryPtr podm;
  SpurUserParamsPtr spur_local;
  
  p_Var1 = get_odometry_ptr();
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    spur->wheel_vel_smooth[local_1c] = p_Var1->wvel[local_1c];
  }
  spur->vref_smooth = p_Var1->v;
  spur->wref_smooth = p_Var1->w;
  return;
}

Assistant:

void update_ref_speed(SpurUserParamsPtr spur)
{
  OdometryPtr podm;
  int i;

  podm = get_odometry_ptr();
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    spur->wheel_vel_smooth[i] = podm->wvel[i];
  }
  spur->vref_smooth = podm->v;
  spur->wref_smooth = podm->w;
}